

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O3

Bigint * Balloc(int k)

{
  Bigint *pBVar1;
  ulong uVar2;
  uint uVar3;
  
  if (k < 8) {
    pBVar1 = TI0.Freelist[k];
    if (pBVar1 != (Bigint *)0x0) {
      TI0.Freelist[k] = pBVar1->next;
      goto LAB_00110f09;
    }
    uVar3 = 1 << ((byte)k & 0x1f);
    uVar2 = (ulong)uVar3 * 4 + 0x23;
    if (0x120 < ((long)(pmem_next + -0x24cee) >> 3) + (uVar2 >> 3)) goto LAB_00110ef0;
    pBVar1 = (Bigint *)pmem_next;
    pmem_next = pmem_next + (uVar2 >> 3);
  }
  else {
    uVar3 = 1 << ((byte)k & 0x1f);
    uVar2 = (long)(int)uVar3 * 4 + 0x23;
LAB_00110ef0:
    pBVar1 = (Bigint *)malloc(uVar2 & 0x7fffffff8);
  }
  pBVar1->k = k;
  pBVar1->maxwds = uVar3;
LAB_00110f09:
  pBVar1->sign = 0;
  pBVar1->wds = 0;
  return pBVar1;
}

Assistant:

static Bigint *
Balloc(int k MTd)
{
	int x;
	Bigint *rv;
#ifndef Omit_Private_Memory
	unsigned int len;
#endif
#ifdef MULTIPLE_THREADS
	ThInfo *TI;

	if (!(TI = *PTI))
		*PTI = TI = get_TI();
	if (TI == &TI0)
		ACQUIRE_DTOA_LOCK(0);
#endif
	/* The k > Kmax case does not need ACQUIRE_DTOA_LOCK(0), */
	/* but this case seems very unlikely. */
	if (k <= Kmax && (rv = freelist[k]))
		freelist[k] = rv->next;
	else {
		x = 1 << k;
#ifdef Omit_Private_Memory
		rv = (Bigint *)MALLOC(sizeof(Bigint) + (x-1)*sizeof(ULong));
#else
		len = (sizeof(Bigint) + (x-1)*sizeof(ULong) + sizeof(double) - 1)
			/sizeof(double);
		if (k <= Kmax && pmem_next - private_mem + len <= PRIVATE_mem
#ifdef MULTIPLE_THREADS
			&& TI == TI1
#endif
			) {
			rv = (Bigint*)pmem_next;
			pmem_next += len;
			}
		else
			rv = (Bigint*)MALLOC(len*sizeof(double));
#endif
		rv->k = k;
		rv->maxwds = x;
		}
#ifdef MULTIPLE_THREADS
	if (TI == &TI0)
		FREE_DTOA_LOCK(0);
#endif
	rv->sign = rv->wds = 0;
	return rv;
	}